

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O0

void __thiscall LengauerTarjan::find_doms(LengauerTarjan *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  reference piVar6;
  vector<int,_std::allocator<int>_> *this_00;
  long in_RDI;
  int w_1;
  int i_1;
  int u_1;
  int v_1;
  int u;
  int v;
  iterator it;
  int w;
  int i;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  buckets;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  value_type vVar7;
  LengauerTarjan *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_a4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  int local_54;
  int local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_20;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)(in_RDI + 0x28));
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2b30d3);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2b30e5);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),in_stack_ffffffffffffff00,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2b3110);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff00);
  for (local_50 = *(int *)(in_RDI + 0xb8); 0 < local_50; local_50 = local_50 + -1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x70),(long)local_50);
    local_54 = *pvVar5;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              (&local_60);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&preds,(long)local_54);
    local_60._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    while( true ) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&preds,(long)local_54);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffef0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (!bVar2) break;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_60);
      iVar3 = EVAL((LengauerTarjan *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)iVar3);
      iVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)local_54);
      if (iVar1 < *pvVar5) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)iVar3);
        vVar7 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)local_54);
        *pvVar5 = vVar7;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)local_54);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x70),(long)*pvVar5);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&local_20,(long)*pvVar5);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffff00,
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
    ;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)local_54);
    LINK(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)local_54);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&local_20,(long)*pvVar5);
    local_60._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    while( true ) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)local_54);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](&local_20,(long)*pvVar5);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffef0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (!bVar2) break;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_60);
      iVar1 = *piVar6;
      iVar4 = EVAL((LengauerTarjan *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)iVar4);
      iVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)iVar1);
      if (*pvVar5 <= iVar3) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)local_54);
        iVar4 = *pvVar5;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0),(long)iVar1);
      *pvVar5 = iVar4;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)local_54);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&local_20,(long)*pvVar5);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2b353e);
  }
  for (local_a4 = 1; local_a4 <= *(int *)(in_RDI + 0xb8); local_a4 = local_a4 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x70),(long)local_a4);
    iVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0),(long)iVar1);
    vVar7 = *pvVar5;
    in_stack_ffffffffffffff00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x70);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)iVar1);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffff00,(long)*pvVar5);
    if (vVar7 != *pvVar5) {
      this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0),(long)iVar1);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar5);
      vVar7 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0),(long)iVar1);
      *pvVar5 = vVar7;
    }
  }
  vVar7 = *(value_type *)(in_RDI + 8);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa0),
                      (long)*(int *)(in_RDI + 8));
  *pvVar5 = vVar7;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void LengauerTarjan::find_doms() {
	// for (int i = 0; i < preds.size(); i++) {
	//     cout <<"Preds of "<<i<<": ";
	//     for (int j = 0; j < preds[i].size(); j++) {
	//             cout <<preds[i][j]<<", ";
	//     }
	//     cout<<endl;
	// }
	// cout << "Semi ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< semi[i]<<") ";
	// cout<<endl;
	// cout << "vertex ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< vertex[i]<<") ";
	// cout<<endl;
	// cout << "label ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< label[i]<<") ";
	// cout<<endl;
	// cout << "parent ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< parent[i]<<") ";
	// cout<<endl;
	// cout <<"count "<<count<<endl;

	std::vector<std::vector<int> > buckets =
			std::vector<std::vector<int> >(in.size(), std::vector<int>());

	for (int i = count; i >= 1; i--) {
		const int w = vertex[i];
		std::vector<int>::iterator it;
		for (it = preds[w].begin(); it != preds[w].end(); it++) {
			const int v = *it;
			const int u = EVAL(v);
			if (semi[u] < semi[w]) {
				semi[w] = semi[u];
			}
		}
		buckets[vertex[semi[w]]].push_back(w);
		LINK(parent[w], w);
		for (it = buckets[parent[w]].begin(); it != buckets[parent[w]].end(); it++) {
			const int v = *it;
			const int u = EVAL(v);
			idom[v] = (semi[u] < semi[v]) ? u : parent[w];
		}
		buckets[parent[w]].clear();
	}

	for (int i = 1; i <= count; i++) {
		const int w = vertex[i];
		if (idom[w] != vertex[semi[w]]) {
			idom[w] = idom[idom[w]];
		}
	}
	idom[root] = root;

}